

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetailedFormatter.h
# Opt level: O2

string * __thiscall
SLogLib::DetailedFormatter::formatMessage_abi_cxx11_
          (string *__return_storage_ptr__,DetailedFormatter *this,Message *msg)

{
  long lVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  CallInfo _callInfo;
  CallInfo _callInfo1;
  ostringstream _stream;
  
  CallInfo::CallInfo(&_callInfo,(CallInfo *)(*(long *)(*(long *)(msg + 0x38) + 8) + -0x48));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&_stream);
  poVar2 = std::operator<<((ostream *)&_stream,"Msg Level  : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(msg + 0x30));
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&_stream,"Time       : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ushort *)(msg + 0x20));
  poVar2 = std::operator<<(poVar2,"-");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ushort *)(msg + 0x22));
  poVar2 = std::operator<<(poVar2,"-");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ushort *)(msg + 0x26));
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ushort *)(msg + 0x28));
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ushort *)(msg + 0x2a));
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ushort *)(msg + 0x2c));
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ushort *)(msg + 0x2e));
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&_stream,"Process ID : ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&_stream,"Thread ID  : ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&_stream,"FileName   : ");
  poVar2 = std::operator<<(poVar2,(string *)&_callInfo);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&_stream,"FuncName   : ");
  poVar2 = std::operator<<(poVar2,(string *)&_callInfo.mFuncName);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&_stream,"Line No.   : ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&_stream,"CallStack  : ");
  lVar4 = 0;
  for (uVar3 = 0; lVar1 = **(long **)(msg + 0x38),
      uVar3 < (ulong)(((*(long **)(msg + 0x38))[1] - lVar1) / 0x48); uVar3 = uVar3 + 1) {
    CallInfo::CallInfo(&_callInfo1,(CallInfo *)(lVar1 + lVar4));
    poVar2 = (ostream *)&_stream;
    if (uVar3 != 0) {
      poVar2 = std::operator<<((ostream *)&_stream,"             ");
    }
    std::operator<<(poVar2,(string *)&_callInfo1);
    poVar2 = std::operator<<((ostream *)&_stream," : ");
    std::operator<<(poVar2,(string *)&_callInfo1.mFuncName);
    poVar2 = std::operator<<((ostream *)&_stream," [");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"]");
    std::endl<char,std::char_traits<char>>(poVar2);
    CallInfo::~CallInfo(&_callInfo1);
    lVar4 = lVar4 + 0x48;
  }
  poVar2 = std::operator<<((ostream *)&_stream,"Message    : ");
  poVar2 = std::operator<<(poVar2,(string *)msg);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&_stream);
  CallInfo::~CallInfo(&_callInfo);
  return __return_storage_ptr__;
}

Assistant:

inline std::string formatMessage(const Message& msg) const override
	{
		size_t         _size     = msg.mCallStack->size();
		const CallInfo _callInfo = (*msg.mCallStack)[_size-1];
		
		std::ostringstream _stream;
		_stream << "Msg Level  : " << toInteger(msg.mLevel)       << std::endl;
		_stream << "Time       : " << msg.mDateTime.mYear         << "-"
								   << msg.mDateTime.mMonth        << "-"
								   << msg.mDateTime.mDay          << " "
								   << msg.mDateTime.mHour         << ":"
								   << msg.mDateTime.mMinute       << ":"
								   << msg.mDateTime.mSecond       << ":"
								   << msg.mDateTime.mMilliseconds << std::endl;
		_stream << "Process ID : " << msg.mProcessId              << std::endl;
		_stream << "Thread ID  : " << msg.mThreadId               << std::endl;
		_stream << "FileName   : " << _callInfo.mFileName         << std::endl;
		_stream << "FuncName   : " << _callInfo.mFuncName         << std::endl;
		_stream << "Line No.   : " << _callInfo.mLineNumber       << std::endl;
		_stream << "CallStack  : ";
		
		for(size_t i=0 ; i<msg.mCallStack->size() ; ++i)
		{
			const CallInfo _callInfo1 = (*msg.mCallStack)[i];
			
			if(i==0)
			{
				_stream << _callInfo1.mFileName;
			}
			else
			{
				_stream << "             " << _callInfo1.mFileName;
			}
			_stream << " : " << _callInfo1.mFuncName;
			_stream << " [" << _callInfo1.mLineNumber << "]" << std::endl;
		}
		
		_stream << "Message    : " << msg.mUserMessage << std::endl << std::endl;
		return _stream.str();
	}